

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O0

void __thiscall cmSearchPath::AddPathInternal(cmSearchPath *this,string *path,char *base)

{
  ulong uVar1;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar2;
  undefined1 local_40 [8];
  string collapsed;
  char *base_local;
  string *path_local;
  cmSearchPath *this_local;
  
  collapsed.field_2._8_8_ = base;
  if (this->FC == (cmFindCommon *)0x0) {
    __assert_fail("this->FC != CM_NULLPTR",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmSearchPath.cxx"
                  ,0xd4,"void cmSearchPath::AddPathInternal(const std::string &, const char *)");
  }
  cmsys::SystemTools::CollapseFullPath((string *)local_40,path,base);
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) == 0) &&
     (pVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(&this->FC->SearchPathsEmitted,(value_type *)local_40),
     ((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Paths,(value_type *)local_40);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmSearchPath::AddPathInternal(const std::string& path, const char* base)
{
  assert(this->FC != CM_NULLPTR);

  std::string collapsed = cmSystemTools::CollapseFullPath(path, base);

  if (collapsed.empty()) {
    return;
  }

  // Insert the path if has not already been emitted.
  if (this->FC->SearchPathsEmitted.insert(collapsed).second) {
    this->Paths.push_back(collapsed);
  }
}